

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O1

Vec3f getBarycentricCoordinates(Vec3f *AB,Vec3f *AC,Vec3f *PA)

{
  float *in_RDI;
  float fVar1;
  float fVar2;
  Vec3f VVar3;
  
  fVar2 = AC->x * PA->y - AC->y * PA->x;
  fVar1 = PA->x * AB->y - PA->y * AB->x;
  VVar3.x = AB->x * AC->y - AB->y * AC->x;
  VVar3.y = 0.0;
  VVar3.z = fVar1 / VVar3.x;
  *in_RDI = 1.0 - (fVar2 + fVar1) / VVar3.x;
  in_RDI[1] = fVar2 / VVar3.x;
  in_RDI[2] = VVar3.z;
  return VVar3;
}

Assistant:

Vec3f getBarycentricCoordinates(const Vec3f &AB, const Vec3f &AC, const Vec3f &PA){
    Vec3f vecX, vecY, coor;
    vecX = Vec3f(AB.x, AC.x, PA.x);
    vecY = Vec3f(AB.y, AC.y, PA.y);
    coor = vecX^vecY;
    return Vec3f((1.f - (coor.x + coor.y)/coor.z), (coor.x / coor.z), (coor.y / coor.z));
}